

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O2

bool __thiscall cppnet::TimerContainer::RmTimer(TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t)

{
  element_type *peVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  undefined1 uVar7;
  TimerContainer *this_00;
  const_iterator __position;
  _Base_ptr *this_01;
  uint16_t cur_index;
  uint16_t type;
  uint32_t left_time;
  shared_ptr<cppnet::TimerSlot> ptr;
  shared_ptr<cppnet::TimerSlot> target;
  uint16_t local_68;
  uint16_t local_66;
  key_type_conflict local_64;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_60);
  if ((TimerContainer *)local_60._M_ptr != (TimerContainer *)0x0) {
    local_68 = 0;
    local_66 = 0;
    this_00 = (TimerContainer *)local_60._M_ptr;
    TimerSlot::GetCurIndex(local_60._M_ptr,&local_68,&local_66);
    uVar2 = local_66;
    uVar3 = TimeUnit2TimeType(this_00,this->_time_unit);
    if (uVar2 == uVar3) {
      TimerSlot::RmInTimer(local_60._M_ptr);
      Bitmap::Remove(&this->_bitmap,(uint)local_68);
      local_64 = TimerSlot::GetLeftInterval(local_60._M_ptr);
      local_50._M_ptr._0_4_ = (uint)local_68;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->_timer_wheel)._M_h,(key_type_conflict *)&local_50);
      uVar7 = 1;
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_0011229e;
      if ((this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        local_64 = 0;
      }
      iVar6 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
              ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
                      *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                               ._M_cur + 0x10),&local_64);
      if (iVar6._M_node !=
          (_Base_ptr)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                 ._M_cur + 0x18)) {
        this_01 = &iVar6._M_node[1]._M_parent;
        __position._M_node = (_List_node_base *)this_01;
        while (__position._M_node = (__position._M_node)->_M_next,
              __position._M_node != (_List_node_base *)this_01) {
          std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,__position._M_node + 1);
          if ((TimerContainer *)CONCAT44(local_50._M_ptr._4_4_,(uint)local_50._M_ptr) ==
              (TimerContainer *)local_60._M_ptr) {
            std::__cxx11::
            list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
            ::erase((list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                     *)this_01,__position);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
            break;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        }
        goto LAB_0011229e;
      }
    }
    else {
      peVar1 = (this->_sub_timer).
               super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        std::__weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                  (&local_40,&t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>);
        iVar4 = (*(peVar1->super_Timer)._vptr_Timer[1])(peVar1,&local_40);
        uVar7 = (undefined1)iVar4;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_40._M_refcount);
        goto LAB_0011229e;
      }
    }
  }
  uVar7 = 0;
LAB_0011229e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return (bool)uVar7;
}

Assistant:

bool TimerContainer::RmTimer(std::weak_ptr<TimerSlot> t) {
    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    uint16_t cur_index = 0;
    uint16_t type = 0;
    ptr->GetCurIndex(cur_index, type);
    if (type == TimeUnit2TimeType(_time_unit)) {
        ptr->RmInTimer();
        _bitmap.Remove(cur_index);
        uint32_t left_time = ptr->GetLeftInterval();
        auto timer_map = _timer_wheel.find(cur_index);
        if (timer_map == _timer_wheel.end()) {
            return true;
        }
        // don't have sub timer
        if (!_sub_timer) {
            left_time = 0;
        }
        auto timer_list = timer_map->second.find(left_time);
        if (timer_list == timer_map->second.end()) {
            return false;
        }
        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); ++timer) {
            auto target = timer->lock();
            if (target == ptr) {
                timer_list->second.erase(timer);
                return true;
            }
        }
        return true;
    }

    if (_sub_timer) {
        return _sub_timer->RmTimer(t);
    }
    return false;
}